

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResponseBase.h
# Opt level: O2

set<Token,_std::less<Token>,_std::allocator<Token>_> * __thiscall
ResponseBase::extractStdTokensFromLine
          (set<Token,_std::less<Token>,_std::allocator<Token>_> *__return_storage_ptr__,
          ResponseBase *this,string *line)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  _If_sv<std::basic_string_view<char>,_size_type> _Var6;
  size_t sVar7;
  ulong index;
  undefined1 local_c8 [8];
  set<Token,_std::less<Token>,_std::allocator<Token>_> subSet;
  string_view tokenStartString;
  char local_78;
  undefined7 uStack_77;
  size_type sStack_70;
  ResponseBase *local_68;
  _If_sv<std::basic_string_view<char>,_size_type> local_60;
  undefined1 local_58 [8];
  string tokenValue;
  
  subSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 5;
  tokenStartString._M_len = (size_t)anon_var_dwarf_141737;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68 = this;
  tokenValue.field_2._8_8_ = __return_storage_ptr__;
  _Var6 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                    ((string *)line,
                     (basic_string_view<char,_std::char_traits<char>_> *)
                     &subSet._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  do {
    if (_Var6 == 0xffffffffffffffff) {
      return (set<Token,_std::less<Token>,_std::allocator<Token>_> *)tokenValue.field_2._8_8_;
    }
    index = subSet._M_t._M_impl.super__Rb_tree_header._M_node_count + _Var6;
    local_60 = _Var6;
    while (uVar3 = line->_M_string_length, index < uVar3) {
      pcVar4 = (line->_M_dataplus)._M_p;
      cVar2 = pcVar4[index];
      iVar5 = isalnum((int)cVar2);
      if (iVar5 == 0) {
        if (cVar2 == ':') {
          if ((uVar3 <= index + 1) || (pcVar4[index + 1] != ':')) break;
          index = index + 2;
        }
        else {
          if (cVar2 != '<') {
            if (cVar2 == '_') goto LAB_00167cde;
            break;
          }
          sVar7 = braceEnd(line,index,'<','>');
          if (sVar7 == 0xffffffffffffffff) break;
          std::__cxx11::string::substr((ulong)local_58,(ulong)line);
          extractStdTokensFromLine
                    ((set<Token,_std::less<Token>,_std::allocator<Token>_> *)local_c8,local_68,
                     (string *)local_58);
          moveInsert<Token>((set<Token,_std::less<Token>,_std::allocator<Token>_> *)local_c8,
                            (set<Token,_std::less<Token>,_std::allocator<Token>_> *)
                            tokenValue.field_2._8_8_);
          index = sVar7 + 1;
          std::
          _Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
          ~_Rb_tree((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
                     *)local_c8);
          std::__cxx11::string::~string((string *)local_58);
        }
      }
      else {
LAB_00167cde:
        index = index + 1;
      }
    }
    std::__cxx11::string::substr((ulong)local_58,(ulong)line);
    if (((pointer)((long)local_58 + -1))[(long)tokenValue._M_dataplus._M_p] != ':') {
      if (local_58 == (undefined1  [8])&tokenValue._M_string_length) {
        sStack_70 = tokenValue.field_2._M_allocated_capacity;
        tokenStartString._M_str = &local_78;
      }
      else {
        tokenStartString._M_str = (char *)local_58;
      }
      _local_78 = CONCAT71(tokenValue._M_string_length._1_7_,(undefined1)tokenValue._M_string_length
                          );
      tokenValue._M_dataplus._M_p = (pointer)0x0;
      tokenValue._M_string_length._0_1_ = 0;
      local_58 = (undefined1  [8])&tokenValue._M_string_length;
      Token::Token((Token *)local_c8,(string *)&tokenStartString._M_str);
      std::_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>::
      _M_insert_unique<Token>
                ((_Rb_tree<Token,_Token,_std::_Identity<Token>,_std::less<Token>,_std::allocator<Token>_>
                  *)tokenValue.field_2._8_8_,(Token *)local_c8);
      std::__cxx11::string::~string((string *)local_c8);
      std::__cxx11::string::~string((string *)&tokenStartString._M_str);
    }
    _Var6 = std::__cxx11::string::find<std::basic_string_view<char,std::char_traits<char>>>
                      ((string *)line,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       &subSet._M_t._M_impl.super__Rb_tree_header._M_node_count,index);
    std::__cxx11::string::~string((string *)local_58);
  } while( true );
}

Assistant:

std::set<Token> extractStdTokensFromLine(const std::string& line) const {
        const std::string_view tokenStartString = "std::";

        std::set<Token> tokens;

        size_t tokenBegin = line.find(tokenStartString);
        while (tokenBegin != std::string::npos) {
            size_t tokenEnd = tokenBegin + tokenStartString.length();

            while (tokenEnd < line.length()) {
                if (std::isalnum(line[tokenEnd])) {
                    tokenEnd++;
                } else if (line[tokenEnd] == '_') {
                    tokenEnd++;
                } else if ((line[tokenEnd] == ':') and (tokenEnd + 1 < line.length()) and (line[tokenEnd + 1] == ':')) {
                    tokenEnd += 2;
                } else if (line[tokenEnd] == '<') {
                    const size_t templateEnd = braceEnd(line, tokenEnd, '<', '>');
                    if (templateEnd == std::string::npos) {
                        break;
                    }

                    const std::string templateContent = line.substr(tokenEnd + 1, templateEnd - tokenEnd);
                    std::set<Token> subSet = extractStdTokensFromLine(templateContent);
                    moveInsert(std::move(subSet), tokens);
                    tokenEnd = templateEnd + 1;
                } else {
                    break;
                }
            }

            std::string tokenValue = line.substr(tokenBegin, tokenEnd - tokenBegin);
            if (tokenValue.back() != ':') {
                tokens.insert(Token(std::move(tokenValue)));
            }

            tokenBegin = line.find(tokenStartString, tokenEnd);
        }

        return tokens;
    }